

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<kj::StringTree,char_const*,kj::StringPtr&,char,kj::StringTree,char>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char **params_1,
          StringPtr *params_2,char *params_3,StringTree *params_4,char *params_5)

{
  StringTree *pSVar1;
  char **value;
  StringPtr *value_00;
  char *pcVar2;
  StringTree *pSVar3;
  StringTree *__return_storage_ptr___00;
  char local_5a [1];
  char local_59 [1];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  NoInfer<kj::StringTree> *local_38;
  StringTree *params_local_4;
  char *params_local_3;
  StringPtr *params_local_2;
  char **params_local_1;
  StringTree *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (NoInfer<kj::StringTree> *)params_3;
  params_local_4 = (StringTree *)params_2;
  params_local_3 = (char *)params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (char **)this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = fwd<char_const*>((NoInfer<const_char_*> *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<char_const*>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_58 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_00);
  pcVar2 = fwd<char>((NoInfer<char> *)params_local_4);
  local_59[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar2);
  pSVar3 = fwd<kj::StringTree>(local_38);
  pSVar3 = _::toStringTreeOrCharSequence(pSVar3);
  pcVar2 = fwd<char>((NoInfer<char> *)params_4);
  local_5a[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar2);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr___00,pSVar1,(StringTree *)&local_48,&local_58,
             (ArrayPtr<const_char> *)local_59,(FixedArray<char,_1UL> *)pSVar3,(StringTree *)local_5a
             ,(FixedArray<char,_1UL> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}